

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkTestTools.cpp
# Opt level: O3

void __thiscall test::FunctionTimer::FunctionTimer(FunctionTimer *this,string *name)

{
  (this->CallLock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->CallLock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->CallLock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->CallLock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0
  ;
  (this->CallLock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0
  ;
  this->t0 = 0;
  this->Invokations = 0;
  this->TotalUsec = 0;
  (this->FunctionName)._M_dataplus._M_p = (pointer)&(this->FunctionName).field_2;
  (this->FunctionName)._M_string_length = 0;
  (this->FunctionName).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->FunctionName);
  return;
}

Assistant:

FunctionTimer::FunctionTimer(const std::string& name)
{
    FunctionName = name;
}